

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeStatement(ExpressionContext *ctx,SynBase *syntax)

{
  bool bVar1;
  int iVar2;
  ExprAliasDefinition *pEVar3;
  ExprError *expr;
  undefined4 extraout_var;
  TypeBase *type;
  ExprDoWhile *pEVar4;
  ExprContinue *pEVar5;
  ExprVariableDefinitions *pEVar6;
  ExprSwitch *pEVar7;
  ExprBreak *pEVar8;
  ExprWhile *pEVar9;
  ExprFor *pEVar10;
  ExprBlock *pEVar11;
  ExprBase *pEVar12;
  SynFunctionDefinition *node;
  ExprError *this;
  
  if (syntax != (SynBase *)0x0) {
    switch(syntax->typeID) {
    case 0x16:
      pEVar3 = AnalyzeTypedef(ctx,(SynTypedef *)syntax);
      return &pEVar3->super_ExprBase;
    case 0x22:
      pEVar12 = AnalyzeReturn(ctx,(SynReturn *)syntax);
      return pEVar12;
    case 0x23:
      pEVar12 = AnalyzeYield(ctx,(SynYield *)syntax);
      return pEVar12;
    case 0x24:
      pEVar8 = AnalyzeBreak(ctx,(SynBreak *)syntax);
      return &pEVar8->super_ExprBase;
    case 0x25:
      pEVar5 = AnalyzeContinue(ctx,(SynContinue *)syntax);
      return &pEVar5->super_ExprBase;
    case 0x26:
      pEVar11 = AnalyzeBlock(ctx,(SynBlock *)syntax,true);
      return &pEVar11->super_ExprBase;
    case 0x27:
      pEVar12 = AnalyzeIfElse(ctx,(SynIfElse *)syntax);
      return pEVar12;
    case 0x28:
      pEVar10 = AnalyzeFor(ctx,(SynFor *)syntax);
      return &pEVar10->super_ExprBase;
    case 0x2a:
      pEVar10 = AnalyzeForEach(ctx,(SynForEach *)syntax);
      return &pEVar10->super_ExprBase;
    case 0x2b:
      pEVar9 = AnalyzeWhile(ctx,(SynWhile *)syntax);
      return &pEVar9->super_ExprBase;
    case 0x2c:
      pEVar4 = AnalyzeDoWhile(ctx,(SynDoWhile *)syntax);
      return &pEVar4->super_ExprBase;
    case 0x2e:
      pEVar7 = AnalyzeSwitch(ctx,(SynSwitch *)syntax);
      return &pEVar7->super_ExprBase;
    case 0x34:
      pEVar6 = AnalyzeVariableDefinitions(ctx,(SynVariableDefinitions *)syntax);
      return &pEVar6->super_ExprBase;
    case 0x37:
      pEVar12 = AnalyzeFunctionDefinition
                          (ctx,(SynFunctionDefinition *)syntax,(FunctionData *)0x0,
                           (TypeFunction *)0x0,(TypeBase *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),
                           true,false,true);
      return pEVar12;
    case 0x3c:
      pEVar12 = AnalyzeClassPrototype(ctx,(SynClassPrototype *)syntax);
      return pEVar12;
    case 0x3f:
      pEVar12 = AnalyzeClassDefinition
                          (ctx,(SynClassDefinition *)syntax,(TypeGenericClassProto *)0x0,
                           (IntrusiveList<TypeHandle>)ZEXT816(0));
      return pEVar12;
    case 0x40:
      pEVar12 = AnalyzeEnumDefinition(ctx,(SynEnumDefinition *)syntax);
      return pEVar12;
    case 0x41:
      pEVar11 = AnalyzeNamespaceDefinition(ctx,(SynNamespaceDefinition *)syntax);
      return &pEVar11->super_ExprBase;
    }
  }
  expr = (ExprError *)AnalyzeExpression(ctx,syntax);
  bVar1 = AssertValueExpression(ctx,syntax,(ExprBase *)expr);
  this = expr;
  if (!bVar1) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    this = (ExprError *)CONCAT44(extraout_var,iVar2);
    type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError(this,syntax,type,(ExprBase *)expr);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeStatement(ExpressionContext &ctx, SynBase *syntax)
{
	if(SynReturn *node = getType<SynReturn>(syntax))
	{
		return AnalyzeReturn(ctx, node);
	}

	if(SynYield *node = getType<SynYield>(syntax))
	{
		return AnalyzeYield(ctx, node);
	}

	if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		return AnalyzeVariableDefinitions(ctx, node);
	}

	if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		return AnalyzeFunctionDefinition(ctx, node, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, false, true);
	}

	if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		IntrusiveList<TypeHandle> generics;

		return AnalyzeClassDefinition(ctx, node, NULL, generics);
	}

	if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		return AnalyzeClassPrototype(ctx, node);
	}

	if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		return AnalyzeEnumDefinition(ctx, node);
	}

	if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		return AnalyzeNamespaceDefinition(ctx, node);
	}

	if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		return AnalyzeTypedef(ctx, node);
	}

	if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		return AnalyzeIfElse(ctx, node);
	}

	if(SynFor *node = getType<SynFor>(syntax))
	{
		return AnalyzeFor(ctx, node);
	}

	if(SynForEach *node = getType<SynForEach>(syntax))
	{
		return AnalyzeForEach(ctx, node);
	}

	if(SynWhile *node = getType<SynWhile>(syntax))
	{
		return AnalyzeWhile(ctx, node);
	}

	if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		return AnalyzeDoWhile(ctx, node);
	}

	if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		return AnalyzeSwitch(ctx, node);
	}

	if(SynBreak *node = getType<SynBreak>(syntax))
	{
		return AnalyzeBreak(ctx, node);
	}

	if(SynContinue *node = getType<SynContinue>(syntax))
	{
		return AnalyzeContinue(ctx, node);
	}

	if(SynBlock *node = getType<SynBlock>(syntax))
	{
		return AnalyzeBlock(ctx, node, true);
	}

	ExprBase *expression = AnalyzeExpression(ctx, syntax);

	if(!AssertValueExpression(ctx, syntax, expression))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), expression);

	return expression;
}